

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

bool __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
::try_dyn_push_move(lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                    *this,progress_guarantee i_progress_guarantee,runtime_type *i_type,
                   void *i_source)

{
  bool bVar1;
  put_transaction<void> local_70;
  undefined1 local_50 [8];
  put_transaction<void> tranasction;
  void *i_source_local;
  runtime_type *i_type_local;
  progress_guarantee i_progress_guarantee_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  
  tranasction.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)i_source;
  try_start_dyn_push_move(&local_70,this,i_progress_guarantee,i_type,i_source);
  lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::put_transaction<void>::put_transaction<void,void>((put_transaction<void> *)local_50,&local_70);
  put_transaction<void>::~put_transaction(&local_70);
  bVar1 = density::lf_heter_queue::put_transaction::operator_cast_to_bool
                    ((put_transaction *)local_50);
  if (bVar1) {
    put_transaction<void>::commit((put_transaction<void> *)local_50);
  }
  put_transaction<void>::~put_transaction((put_transaction<void> *)local_50);
  return bVar1;
}

Assistant:

bool try_dyn_push_move(
          progress_guarantee i_progress_guarantee, const runtime_type & i_type, void * i_source)
        {
            auto tranasction = try_start_dyn_push_move(i_progress_guarantee, i_type, i_source);
            if (!tranasction)
                return false;
            tranasction.commit();
            return true;
        }